

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O0

void __thiscall Fl_Table::_auto_drag_cb(Fl_Table *this)

{
  Fl_Scrollbar *pFVar1;
  Fl_Scrollbar *pFVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  double dVar6;
  int local_18;
  int local_14;
  int ly;
  int lx;
  Fl_Table *this_local;
  
  local_14 = Fl::e_x;
  local_18 = Fl::e_y;
  if (this->_selecting == 8) {
    local_18 = Fl_Widget::y((Fl_Widget *)this);
    iVar3 = col_header_height(this);
    local_18 = local_18 + iVar3;
  }
  else if (this->_selecting == 4) {
    local_14 = Fl_Widget::x((Fl_Widget *)this);
    iVar3 = row_header_width(this);
    local_14 = local_14 + iVar3;
  }
  iVar3 = Fl_Widget::x((Fl_Widget *)this);
  iVar4 = Fl_Widget::w((Fl_Widget *)this);
  if (iVar3 + iVar4 + -0x14 < local_14) {
    iVar3 = Fl_Widget::x((Fl_Widget *)this);
    iVar4 = Fl_Widget::w((Fl_Widget *)this);
    Fl::e_x = iVar3 + iVar4 + -0x14;
    uVar5 = Fl_Widget::visible((Fl_Widget *)this->hscrollbar);
    if (uVar5 != 0) {
      pFVar1 = this->hscrollbar;
      pFVar2 = this->hscrollbar;
      iVar3 = Fl_Scrollbar::value(this->hscrollbar);
      dVar6 = Fl_Valuator::clamp((Fl_Valuator *)pFVar2,(double)(iVar3 + 0x1e));
      Fl_Valuator::value((Fl_Valuator *)pFVar1,dVar6);
    }
    Fl_Widget::do_callback((Fl_Widget *)this->hscrollbar);
    this->_dragging_x = Fl::e_x + -0x1e;
  }
  else {
    iVar3 = Fl_Widget::x((Fl_Widget *)this);
    iVar4 = row_header_width(this);
    if (local_14 < iVar3 + iVar4) {
      iVar3 = Fl_Widget::x((Fl_Widget *)this);
      iVar4 = row_header_width(this);
      Fl::e_x = iVar3 + iVar4 + 1;
      uVar5 = Fl_Widget::visible((Fl_Widget *)this->hscrollbar);
      if (uVar5 != 0) {
        pFVar1 = this->hscrollbar;
        pFVar2 = this->hscrollbar;
        iVar3 = Fl_Scrollbar::value(this->hscrollbar);
        dVar6 = Fl_Valuator::clamp((Fl_Valuator *)pFVar2,(double)(iVar3 + -0x1e));
        Fl_Valuator::value((Fl_Valuator *)pFVar1,dVar6);
      }
      Fl_Widget::do_callback((Fl_Widget *)this->hscrollbar);
      this->_dragging_x = Fl::e_x + 0x1e;
    }
  }
  iVar3 = Fl_Widget::y((Fl_Widget *)this);
  iVar4 = Fl_Widget::h((Fl_Widget *)this);
  if (iVar3 + iVar4 + -0x14 < local_18) {
    iVar3 = Fl_Widget::y((Fl_Widget *)this);
    iVar4 = Fl_Widget::h((Fl_Widget *)this);
    Fl::e_y = iVar3 + iVar4 + -0x14;
    uVar5 = Fl_Widget::visible((Fl_Widget *)this->vscrollbar);
    if (uVar5 != 0) {
      pFVar1 = this->vscrollbar;
      pFVar2 = this->vscrollbar;
      iVar3 = Fl_Scrollbar::value(this->vscrollbar);
      dVar6 = Fl_Valuator::clamp((Fl_Valuator *)pFVar2,(double)(iVar3 + 0x1e));
      Fl_Valuator::value((Fl_Valuator *)pFVar1,dVar6);
    }
    Fl_Widget::do_callback((Fl_Widget *)this->vscrollbar);
    this->_dragging_y = Fl::e_y + -0x1e;
  }
  else {
    iVar3 = Fl_Widget::y((Fl_Widget *)this);
    iVar4 = col_header_height(this);
    if (local_18 < iVar3 + iVar4) {
      iVar3 = Fl_Widget::y((Fl_Widget *)this);
      iVar4 = col_header_height(this);
      Fl::e_y = iVar3 + iVar4 + 1;
      uVar5 = Fl_Widget::visible((Fl_Widget *)this->vscrollbar);
      if (uVar5 != 0) {
        pFVar1 = this->vscrollbar;
        pFVar2 = this->vscrollbar;
        iVar3 = Fl_Scrollbar::value(this->vscrollbar);
        dVar6 = Fl_Valuator::clamp((Fl_Valuator *)pFVar2,(double)(iVar3 + -0x1e));
        Fl_Valuator::value((Fl_Valuator *)pFVar1,dVar6);
      }
      Fl_Widget::do_callback((Fl_Widget *)this->vscrollbar);
      this->_dragging_y = Fl::e_y + 0x1e;
    }
  }
  this->_auto_drag = 2;
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(this,5);
  this->_auto_drag = 1;
  Fl::e_x = local_14;
  Fl::e_y = local_18;
  Fl::check();
  Fl::flush();
  iVar3 = Fl::event_buttons();
  if ((iVar3 != 0) && (this->_auto_drag != 0)) {
    Fl::add_timeout(0.05,_auto_drag_cb2,this);
  }
  return;
}

Assistant:

void Fl_Table::_auto_drag_cb() {
  int lx = Fl::e_x;
  int ly = Fl::e_y;
  if (_selecting == CONTEXT_COL_HEADER)
  { ly = y() + col_header_height(); }
  else if (_selecting == CONTEXT_ROW_HEADER)
  { lx = x() + row_header_width(); }
  if (lx > x() + w() - 20) {
    Fl::e_x = x() + w() - 20;
    if (hscrollbar->visible())
      ((Fl_Slider*)hscrollbar)->value(hscrollbar->clamp(hscrollbar->value() + 30));
    hscrollbar->do_callback();
    _dragging_x = Fl::e_x - 30;
  }
  else if (lx < (x() + row_header_width())) {
    Fl::e_x = x() + row_header_width() + 1;
    if (hscrollbar->visible()) {
      ((Fl_Slider*)hscrollbar)->value(hscrollbar->clamp(hscrollbar->value() - 30));
    }
    hscrollbar->do_callback();
    _dragging_x = Fl::e_x + 30;
  }
  if (ly > y() + h() - 20) {
    Fl::e_y = y() + h() - 20;
    if (vscrollbar->visible()) {
      ((Fl_Slider*)vscrollbar)->value(vscrollbar->clamp(vscrollbar->value() + 30));
    }
    vscrollbar->do_callback();
    _dragging_y = Fl::e_y - 30;
  }
  else if (ly < (y() + col_header_height())) {
    Fl::e_y = y() + col_header_height() + 1;
    if (vscrollbar->visible()) {
      ((Fl_Slider*)vscrollbar)->value(vscrollbar->clamp(vscrollbar->value() - 30));
    }
    vscrollbar->do_callback();
    _dragging_y = Fl::e_y + 30;
  }
  _auto_drag = 2;
  handle(FL_DRAG);
  _auto_drag = 1;
  Fl::e_x = lx;
  Fl::e_y = ly;
  Fl::check();
  Fl::flush();
  if (Fl::event_buttons() && _auto_drag) {
    Fl::add_timeout(0.05, _auto_drag_cb2, this);
  }
}